

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_trim(char *dest,int dest_sz,char *src,char *trim)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  
  uVar3 = sx_strlen(src);
  uVar2 = dest_sz - 1U;
  if ((int)uVar3 < (int)(dest_sz - 1U)) {
    uVar2 = uVar3;
  }
  uVar4 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar5 = 0;
  do {
    if (uVar4 == uVar2) {
      dest[iVar5] = '\0';
      return dest;
    }
    pcVar6 = trim;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\0') {
        dest[iVar5] = src[uVar4];
        iVar5 = iVar5 + 1;
        break;
      }
      pcVar6 = pcVar6 + 1;
    } while (src[uVar4] != cVar1);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

char* sx_trim(char* dest, int dest_sz, const char* src, const char* trim)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        const char* t = trim;
        char sch = src[i];
        bool trim_it = false;
        while (*t) {
            if (sch != *t) {
                ++t;
                continue;
            }
            trim_it = true;
            break;
        }

        if (!trim_it)
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}